

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportFileGenerator.cxx
# Opt level: O2

bool __thiscall
cmExportFileGenerator::PopulateExportProperties
          (cmExportFileGenerator *this,cmGeneratorTarget *gte,ImportPropertyMap *properties,
          string *errorMessage)

{
  bool bVar1;
  cmPropertyMap *this_00;
  cmValue cVar2;
  mapped_type *pmVar3;
  ostream *poVar4;
  string *psVar5;
  pointer name;
  string_view arg;
  string_view str;
  string_view str_00;
  string evaluatedValue;
  ostringstream e;
  string local_200;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1e0;
  string local_1c8 [32];
  ostream local_1a8;
  
  this_00 = cmTarget::GetProperties(gte->Target);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_1a8,"EXPORT_PROPERTIES",(allocator<char> *)&local_200);
  cVar2 = cmPropertyMap::GetPropertyValue(this_00,(string *)&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (cVar2.Value != (string *)0x0) {
    arg._M_str = ((cVar2.Value)->_M_dataplus)._M_p;
    arg._M_len = (cVar2.Value)->_M_string_length;
    cmExpandedList_abi_cxx11_(&local_1e0,arg,false);
    for (name = local_1e0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
        name != local_1e0.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; name = name + 1) {
      str._M_str = (name->_M_dataplus)._M_p;
      str._M_len = name->_M_string_length;
      bVar1 = cmHasLiteralPrefix<10ul>(str,(char (*) [10])"IMPORTED_");
      if ((bVar1) ||
         (str_00._M_str = (name->_M_dataplus)._M_p, str_00._M_len = name->_M_string_length,
         bVar1 = cmHasLiteralPrefix<11ul>(str_00,(char (*) [11])0x5c8586), bVar1)) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
        poVar4 = std::operator<<(&local_1a8,"Target \"");
        psVar5 = cmTarget::GetName_abi_cxx11_(gte->Target);
        poVar4 = std::operator<<(poVar4,(string *)psVar5);
        poVar4 = std::operator<<(poVar4,"\" contains property \"");
        poVar4 = std::operator<<(poVar4,(string *)name);
        poVar4 = std::operator<<(poVar4,"\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* ");
        std::operator<<(poVar4,"properties are reserved.");
        std::__cxx11::stringbuf::str();
        std::__cxx11::string::operator=((string *)errorMessage,(string *)&local_200);
        std::__cxx11::string::~string((string *)&local_200);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
LAB_003070ae:
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~vector(&local_1e0);
        return false;
      }
      cVar2 = cmPropertyMap::GetPropertyValue(this_00,name);
      if (cVar2.Value != (string *)0x0) {
        cmGeneratorExpression::Preprocess(&local_200,cVar2.Value,StripAllGeneratorExpressions,false)
        ;
        bVar1 = std::operator!=(&local_200,cVar2.Value);
        if (bVar1) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_1a8);
          poVar4 = std::operator<<(&local_1a8,"Target \"");
          psVar5 = cmTarget::GetName_abi_cxx11_(gte->Target);
          poVar4 = std::operator<<(poVar4,(string *)psVar5);
          poVar4 = std::operator<<(poVar4,"\" contains property \"");
          poVar4 = std::operator<<(poVar4,(string *)name);
          poVar4 = std::operator<<(poVar4,"\" in EXPORT_PROPERTIES but this property contains a ");
          std::operator<<(poVar4,"generator expression. This is not allowed.");
          std::__cxx11::stringbuf::str();
          std::__cxx11::string::operator=((string *)errorMessage,local_1c8);
          std::__cxx11::string::~string(local_1c8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_1a8);
          std::__cxx11::string::~string((string *)&local_200);
          goto LAB_003070ae;
        }
        pmVar3 = std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::operator[](properties,name);
        std::__cxx11::string::_M_assign((string *)pmVar3);
        std::__cxx11::string::~string((string *)&local_200);
      }
    }
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&local_1e0);
  }
  return true;
}

Assistant:

bool cmExportFileGenerator::PopulateExportProperties(
  cmGeneratorTarget const* gte, ImportPropertyMap& properties,
  std::string& errorMessage)
{
  const auto& targetProperties = gte->Target->GetProperties();
  if (cmValue exportProperties =
        targetProperties.GetPropertyValue("EXPORT_PROPERTIES")) {
    for (auto& prop : cmExpandedList(*exportProperties)) {
      /* Black list reserved properties */
      if (cmHasLiteralPrefix(prop, "IMPORTED_") ||
          cmHasLiteralPrefix(prop, "INTERFACE_")) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but IMPORTED_* and INTERFACE_* "
          << "properties are reserved.";
        errorMessage = e.str();
        return false;
      }
      cmValue propertyValue = targetProperties.GetPropertyValue(prop);
      if (!propertyValue) {
        // Asked to export a property that isn't defined on the target. Do not
        // consider this an error, there's just nothing to export.
        continue;
      }
      std::string evaluatedValue = cmGeneratorExpression::Preprocess(
        *propertyValue, cmGeneratorExpression::StripAllGeneratorExpressions);
      if (evaluatedValue != *propertyValue) {
        std::ostringstream e;
        e << "Target \"" << gte->Target->GetName() << "\" contains property \""
          << prop << "\" in EXPORT_PROPERTIES but this property contains a "
          << "generator expression. This is not allowed.";
        errorMessage = e.str();
        return false;
      }
      properties[prop] = *propertyValue;
    }
  }
  return true;
}